

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_sraiq(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *s;
  TCGLabel *l;
  TCGTemp *ts;
  TCGTemp *ts_00;
  uint uVar1;
  
  s = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode >> 0xb & 0x1f;
  l = gen_new_label_ppc64(s);
  ts = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  ts_00 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  tcg_gen_shri_i64_ppc64
            (s,(TCGv_i64)((long)ts - (long)s),
             *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)),(ulong)uVar1);
  tcg_gen_shli_i64_ppc64
            (s,(TCGv_i64)((long)ts_00 - (long)s),
             *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)),
             (ulong)(0x20 - uVar1));
  tcg_gen_op3_ppc64(s,INDEX_op_or_i64,(TCGArg)ts,(TCGArg)ts,(TCGArg)ts_00);
  tcg_gen_op3_ppc64(s,INDEX_op_st_i64,(TCGArg)ts,(TCGArg)(s->cpu_env + (long)s),0xb18);
  tcg_gen_op2_ppc64(s,INDEX_op_movi_i64,(TCGArg)(cpu_ca + (long)s),0);
  tcg_gen_brcondi_i64_ppc64(s,TCG_COND_EQ,(TCGv_i64)((long)ts_00 - (long)s),0,l);
  tcg_gen_brcondi_i64_ppc64
            (s,TCG_COND_GE,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)),0,l);
  tcg_gen_op2_ppc64(s,INDEX_op_movi_i64,(TCGArg)(cpu_ca + (long)s),1);
  *(byte *)l = *(byte *)l | 1;
  tcg_gen_op1_ppc64(s,INDEX_op_set_label,(TCGArg)l);
  tcg_gen_sari_i64_ppc64
            (s,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0xd & 0xf8)),
             *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)),(ulong)uVar1);
  tcg_temp_free_internal_ppc64(s,ts);
  tcg_temp_free_internal_ppc64(s,ts_00);
  if ((ctx->opcode & 1) != 0) {
    gen_sraiq_cold_1();
  }
  return;
}

Assistant:

static void gen_sraiq(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int sh = SH(ctx->opcode);
    TCGLabel *l1 = gen_new_label(tcg_ctx);
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv t1 = tcg_temp_new(tcg_ctx);
    tcg_gen_shri_tl(tcg_ctx, t0, cpu_gpr[rS(ctx->opcode)], sh);
    tcg_gen_shli_tl(tcg_ctx, t1, cpu_gpr[rS(ctx->opcode)], 32 - sh);
    tcg_gen_or_tl(tcg_ctx, t0, t0, t1);
    gen_store_spr(tcg_ctx, SPR_MQ, t0);
    tcg_gen_movi_tl(tcg_ctx, cpu_ca, 0);
    tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_EQ, t1, 0, l1);
    tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_GE, cpu_gpr[rS(ctx->opcode)], 0, l1);
    tcg_gen_movi_tl(tcg_ctx, cpu_ca, 1);
    gen_set_label(tcg_ctx, l1);
    tcg_gen_sari_tl(tcg_ctx, cpu_gpr[rA(ctx->opcode)], cpu_gpr[rS(ctx->opcode)], sh);
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, cpu_gpr[rA(ctx->opcode)]);
    }
}